

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::insertSpirvRequirement(TIntermediate *this,TSpirvRequirement *spirvReq)

{
  bool bVar1;
  TSpirvRequirement *this_00;
  reference __str;
  reference piVar2;
  value_type *__x;
  int local_84;
  iterator iStack_80;
  int capability;
  iterator __end1_1;
  iterator __begin1_1;
  TSet<int,_std::less<int>_> *__range1_1;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> extension;
  iterator __end1;
  iterator __begin1;
  TSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  *__range1;
  TSpirvRequirement *spirvReq_local;
  TIntermediate *this_local;
  
  if (this->spirvRequirement == (TSpirvRequirement *)0x0) {
    this_00 = (TSpirvRequirement *)
              TSpirvRequirement::operator_new((TSpirvRequirement *)0x70,(size_t)spirvReq);
    TSpirvRequirement::TSpirvRequirement(this_00);
    this->spirvRequirement = this_00;
  }
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                    *)spirvReq);
  extension.field_2._8_8_ =
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              *)spirvReq);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)((long)&extension.field_2 + 8));
    if (!bVar1) break;
    __str = std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
            ::operator*(&__end1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 local_58,__str);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
    ::insert((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_bool>
              *)this->spirvRequirement,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              *)local_58,__x);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  local_58);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::set<int,_std::less<int>,_glslang::pool_allocator<int>_>::begin
                       (&(spirvReq->capabilities).
                         super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>);
  iStack_80 = std::set<int,_std::less<int>,_glslang::pool_allocator<int>_>::end
                        (&(spirvReq->capabilities).
                          super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,&stack0xffffffffffffff80);
    if (!bVar1) break;
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&__end1_1);
    local_84 = *piVar2;
    std::set<int,_std::less<int>,_glslang::pool_allocator<int>_>::insert
              (&(this->spirvRequirement->capabilities).
                super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>,&local_84);
    std::_Rb_tree_const_iterator<int>::operator++(&__end1_1);
  }
  return;
}

Assistant:

void TIntermediate::insertSpirvRequirement(const TSpirvRequirement* spirvReq)
{
    if (!spirvRequirement)
        spirvRequirement = new TSpirvRequirement;

    for (auto extension : spirvReq->extensions)
        spirvRequirement->extensions.insert(extension);

    for (auto capability : spirvReq->capabilities)
        spirvRequirement->capabilities.insert(capability);
}